

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

void __thiscall FTagManager::RemoveSectorTags(FTagManager *this,int sect)

{
  uint uVar1;
  int *piVar2;
  FTagItem *pFVar3;
  int local_18;
  int start;
  int sect_local;
  FTagManager *this_local;
  
  uVar1 = TArray<int,_int>::Size(&this->startForSector);
  if ((uint)sect < uVar1) {
    piVar2 = TArray<int,_int>::operator[](&this->startForSector,(long)sect);
    local_18 = *piVar2;
    if (-1 < local_18) {
      while (pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(long)local_18),
            pFVar3->target == sect) {
        pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(long)local_18);
        pFVar3->target = -1;
        pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(long)local_18);
        pFVar3->tag = -1;
        local_18 = local_18 + 1;
      }
    }
  }
  return;
}

Assistant:

void FTagManager::RemoveSectorTags(int sect)
{
	if (startForSector.Size() > (unsigned int)sect)
	{
		int start = startForSector[sect];
		if (start >= 0)
		{
			while (allTags[start].target == sect)
			{
				allTags[start].tag = allTags[start].target = -1;
				start++;
			}
		}
	}
}